

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTBITDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t l;
  u32 t;
  size_t local_38;
  u32 local_2c;
  
  sVar1 = derTLDec(&local_2c,&local_38,der,count);
  sVar2 = 0xffffffffffffffff;
  if (sVar1 == 0xffffffffffffffff) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar1;
    sVar3 = 0xffffffffffffffff;
    if (local_38 + sVar1 <= count) {
      sVar3 = local_38 + sVar1;
    }
  }
  if ((((local_2c == tag && sVar3 != 0xffffffffffffffff) && (local_38 != 0)) && (*der < 8)) &&
     ((local_38 != 1 || (*der == 0)))) {
    if (val != (octet *)0x0) {
      memMove(val,der + 1,local_38 - 1);
    }
    sVar2 = sVar3;
    if (len != (size_t *)0x0) {
      *len = (local_38 * 8 - (ulong)*der) - 8;
    }
  }
  return sVar2;
}

Assistant:

size_t derTBITDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1) 
		return SIZE_MAX;
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l - 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l - 1));
		memMove(val, v + 1, l - 1);
	}
	// возвратить битовую длину
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = (l - 1) * 8 - v[0];
	}
	return count;
}